

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_&,_const_char_(&)[58]>
::streamReconstructedExpression
          (BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_&,_const_char_(&)[58]>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *in_RDX;
  char *str;
  string *in_R9;
  StringRef op;
  string local_60;
  type local_40;
  
  StringMaker<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,void>::
  convert<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>
            (&local_40,
             (StringMaker<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,void>
              *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<char[58],void>::convert_abi_cxx11_
            (&local_60,(StringMaker<char[58],void> *)this->m_rhs,str);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }